

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,RegRegList l)

{
  char *pcVar1;
  RegList l_00;
  
  if ((this->style->syntax & ~MOIRA_MIT) == GNU) {
    if (l.raw == 0) {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = '#';
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = '0';
      return this;
    }
  }
  else {
    l_00.raw = l.raw & 0xff;
    operator<<(this,l_00);
    l.raw = l.raw & 0xff00;
    if (l.raw != 0 && l_00.raw != 0) {
      pcVar1 = this->ptr;
      this->ptr = pcVar1 + 1;
      *pcVar1 = '/';
    }
  }
  operator<<(this,(RegList)l.raw);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(RegRegList l)
{
    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            l.raw ? *this << RegList{l.raw} : *this << "#0";
            break;

        default:

            u16 regsD = l.raw & 0x00FF;
            u16 regsA = l.raw & 0xFF00;

            *this << RegList { regsD };
            if (regsD && regsA) *this << "/";
            *this << RegList { regsA };
    }

    return *this;
}